

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void gen_store_exclusive(DisasContext_conflict1 *s,int rd,int rt,int rt2,TCGv_i64 addr,int size,
                        int is_pair)

{
  ARMMMUIdx AVar1;
  uint uVar2;
  TCGContext_conflict1 *s_00;
  TCGv_ptr pTVar3;
  int reg;
  MemOp MVar4;
  uintptr_t o_4;
  TCGLabel *l;
  TCGLabel *a1;
  TCGTemp *a2;
  TCGv_i64 pTVar5;
  TCGv_i64 pTVar6;
  TCGv_i64 newv;
  code *func;
  uintptr_t o;
  TCGv_i64 pTVar7;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGv_i64 local_40;
  
  s_00 = s->uc->tcg_ctx;
  l = gen_new_label_aarch64(s_00);
  a1 = gen_new_label_aarch64(s_00);
  tcg_gen_brcond_i64_aarch64(s_00,TCG_COND_NE,addr,s_00->cpu_exclusive_addr,l);
  a2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  pTVar7 = (TCGv_i64)((long)a2 - (long)s_00);
  if (is_pair == 0) {
    pTVar5 = s_00->cpu_exclusive_addr;
    pTVar6 = s_00->cpu_exclusive_val;
    newv = cpu_reg_aarch64(s,rt);
    AVar1 = s->mmu_idx;
    MVar4 = size | s->be_data | MO_ALIGN;
  }
  else {
    if (size != 2) {
      uVar2 = ((s->base).tb)->cflags;
      MVar4 = s->be_data;
      pTVar3 = s_00->cpu_env;
      pTVar5 = s_00->cpu_exclusive_addr;
      pTVar6 = cpu_reg_aarch64(s,rt);
      local_40 = cpu_reg_aarch64(s,rt2);
      local_48 = pTVar6 + (long)s_00;
      local_40 = local_40 + (long)s_00;
      if ((uVar2 >> 0x13 & 1) == 0) {
        if (MVar4 == MO_8) {
          func = helper_paired_cmpxchg64_le_aarch64;
        }
        else {
          func = helper_paired_cmpxchg64_be_aarch64;
        }
      }
      else if (MVar4 == MO_8) {
        func = helper_paired_cmpxchg64_le_parallel_aarch64;
      }
      else {
        func = helper_paired_cmpxchg64_be_parallel_aarch64;
      }
      local_58 = (TCGTemp *)(pTVar3 + (long)s_00);
      local_50 = pTVar5 + (long)s_00;
      tcg_gen_callN_aarch64(s_00,func,(TCGTemp *)((long)s_00 + (long)pTVar7),4,&local_58);
      goto LAB_006a3d95;
    }
    reg = rt;
    if (s->be_data == MO_8) {
      reg = rt2;
      rt2 = rt;
    }
    pTVar5 = cpu_reg_aarch64(s,rt2);
    pTVar6 = cpu_reg_aarch64(s,reg);
    tcg_gen_deposit_i64_aarch64(s_00,pTVar7,pTVar5,pTVar6,0x20,0x20);
    pTVar5 = s_00->cpu_exclusive_addr;
    pTVar6 = s_00->cpu_exclusive_val;
    AVar1 = s->mmu_idx;
    MVar4 = s->be_data | (MO_ALIGN|MO_64);
    newv = pTVar7;
  }
  tcg_gen_atomic_cmpxchg_i64_aarch64(s_00,pTVar7,pTVar5,pTVar6,newv,(ulong)(AVar1 & 0xf),MVar4);
  tcg_gen_setcond_i64_aarch64(s_00,TCG_COND_NE,pTVar7,pTVar7,s_00->cpu_exclusive_val);
LAB_006a3d95:
  pTVar5 = cpu_reg_aarch64(s,rd);
  if (pTVar5 != pTVar7) {
    tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i64,(TCGArg)(pTVar5 + (long)s_00),(TCGArg)a2);
  }
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar7 + (long)s_00));
  *(short *)&a1->field_0x2 = (short)((uint)*(ushort *)&a1->field_0x2 * 0x10000 + 0x10000 >> 0x10);
  tcg_gen_op1_aarch64(s_00,INDEX_op_br,(TCGArg)a1);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_aarch64(s_00,INDEX_op_set_label,(TCGArg)l);
  pTVar7 = cpu_reg_aarch64(s,rd);
  tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)(pTVar7 + (long)s_00),1);
  *(byte *)a1 = *(byte *)a1 | 1;
  tcg_gen_op1_aarch64(s_00,INDEX_op_set_label,(TCGArg)a1);
  tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)(s_00->cpu_exclusive_addr + (long)s_00),
                      0xffffffffffffffff);
  return;
}

Assistant:

static void gen_store_exclusive(DisasContext *s, int rd, int rt, int rt2,
                                TCGv_i64 addr, int size, int is_pair)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* if (env->exclusive_addr == addr && env->exclusive_val == [addr]
     *     && (!is_pair || env->exclusive_high == [addr + datasize])) {
     *     [addr] = {Rt};
     *     if (is_pair) {
     *         [addr + datasize] = {Rt2};
     *     }
     *     {Rd} = 0;
     * } else {
     *     {Rd} = 1;
     * }
     * env->exclusive_addr = -1;
     */
    TCGLabel *fail_label = gen_new_label(tcg_ctx);
    TCGLabel *done_label = gen_new_label(tcg_ctx);
    TCGv_i64 tmp;

    tcg_gen_brcond_i64(tcg_ctx, TCG_COND_NE, addr, tcg_ctx->cpu_exclusive_addr, fail_label);

    tmp = tcg_temp_new_i64(tcg_ctx);
    if (is_pair) {
        if (size == 2) {
            if (s->be_data == MO_LE) {
                tcg_gen_concat32_i64(tcg_ctx, tmp, cpu_reg(s, rt), cpu_reg(s, rt2));
            } else {
                tcg_gen_concat32_i64(tcg_ctx, tmp, cpu_reg(s, rt2), cpu_reg(s, rt));
            }
            tcg_gen_atomic_cmpxchg_i64(tcg_ctx, tmp, tcg_ctx->cpu_exclusive_addr,
                                       tcg_ctx->cpu_exclusive_val, tmp,
                                       get_mem_index(s),
                                       MO_64 | MO_ALIGN | s->be_data);
            tcg_gen_setcond_i64(tcg_ctx, TCG_COND_NE, tmp, tmp, tcg_ctx->cpu_exclusive_val);
        } else if (tb_cflags(s->base.tb) & CF_PARALLEL) {
            if (!HAVE_CMPXCHG128) {
                gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
                s->base.is_jmp = DISAS_NORETURN;
            } else if (s->be_data == MO_LE) {
                gen_helper_paired_cmpxchg64_le_parallel(tcg_ctx, tmp, tcg_ctx->cpu_env,
                                                        tcg_ctx->cpu_exclusive_addr,
                                                        cpu_reg(s, rt),
                                                        cpu_reg(s, rt2));
            } else {
                gen_helper_paired_cmpxchg64_be_parallel(tcg_ctx, tmp, tcg_ctx->cpu_env,
                                                        tcg_ctx->cpu_exclusive_addr,
                                                        cpu_reg(s, rt),
                                                        cpu_reg(s, rt2));
            }
        } else if (s->be_data == MO_LE) {
            gen_helper_paired_cmpxchg64_le(tcg_ctx, tmp, tcg_ctx->cpu_env, tcg_ctx->cpu_exclusive_addr,
                                           cpu_reg(s, rt), cpu_reg(s, rt2));
        } else {
            gen_helper_paired_cmpxchg64_be(tcg_ctx, tmp, tcg_ctx->cpu_env, tcg_ctx->cpu_exclusive_addr,
                                           cpu_reg(s, rt), cpu_reg(s, rt2));
        }
    } else {
        tcg_gen_atomic_cmpxchg_i64(tcg_ctx, tmp, tcg_ctx->cpu_exclusive_addr, tcg_ctx->cpu_exclusive_val,
                                   cpu_reg(s, rt), get_mem_index(s),
                                   size | MO_ALIGN | s->be_data);
        tcg_gen_setcond_i64(tcg_ctx, TCG_COND_NE, tmp, tmp, tcg_ctx->cpu_exclusive_val);
    }
    tcg_gen_mov_i64(tcg_ctx, cpu_reg(s, rd), tmp);
    tcg_temp_free_i64(tcg_ctx, tmp);
    tcg_gen_br(tcg_ctx, done_label);

    gen_set_label(tcg_ctx, fail_label);
    tcg_gen_movi_i64(tcg_ctx, cpu_reg(s, rd), 1);
    gen_set_label(tcg_ctx, done_label);
    tcg_gen_movi_i64(tcg_ctx, tcg_ctx->cpu_exclusive_addr, -1);
}